

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTriangleMeshShape.cpp
# Opt level: O3

void __thiscall
cbtTriangleMeshShape::getAabb
          (cbtTriangleMeshShape *this,cbtTransform *trans,cbtVector3 *aabbMin,cbtVector3 *aabbMax)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  fVar1 = (this->m_localAabbMax).m_floats[0];
  fVar2 = (this->m_localAabbMax).m_floats[1];
  fVar3 = (this->m_localAabbMin).m_floats[0];
  fVar4 = (this->m_localAabbMin).m_floats[1];
  fVar10 = ((this->m_localAabbMax).m_floats[2] - (this->m_localAabbMin).m_floats[2]) * 0.5;
  fVar11 = fVar10;
  (*(this->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])();
  fVar12 = fVar11;
  (*(this->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])(this);
  fVar13 = fVar12;
  (*(this->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])(this);
  auVar22._8_4_ = 0x7fffffff;
  auVar22._0_8_ = 0x7fffffff7fffffff;
  auVar22._12_4_ = 0x7fffffff;
  fVar5 = (trans->m_basis).m_el[2].m_floats[1];
  fVar13 = fVar13 + fVar10;
  auVar15 = vinsertps_avx(*(undefined1 (*) [16])((trans->m_basis).m_el[0].m_floats + 1),
                          ZEXT416((uint)(trans->m_basis).m_el[1].m_floats[1]),0x10);
  fVar12 = fVar12 + (fVar2 - fVar4) * 0.5;
  fVar11 = fVar11 + (fVar1 - fVar3) * 0.5;
  auVar14 = vinsertps_avx(*(undefined1 (*) [16])((trans->m_basis).m_el[0].m_floats + 2),
                          ZEXT416((uint)(trans->m_basis).m_el[1].m_floats[2]),0x10);
  auVar7 = vandps_avx(ZEXT416((uint)fVar5),auVar22);
  auVar18 = ZEXT416((uint)(trans->m_basis).m_el[2].m_floats[0]);
  auVar8 = vandps_avx(auVar18,auVar22);
  auVar17 = ZEXT416((uint)(trans->m_basis).m_el[2].m_floats[2]);
  auVar9 = vandps_avx(auVar17,auVar22);
  fVar1 = ((this->m_localAabbMax).m_floats[1] + (this->m_localAabbMin).m_floats[1]) * 0.5;
  fVar2 = ((this->m_localAabbMax).m_floats[0] + (this->m_localAabbMin).m_floats[0]) * 0.5;
  fVar3 = ((this->m_localAabbMax).m_floats[2] + (this->m_localAabbMin).m_floats[2]) * 0.5;
  auVar19 = vinsertps_avx(*(undefined1 (*) [16])(trans->m_basis).m_el[0].m_floats,
                          ZEXT416((uint)(trans->m_basis).m_el[1].m_floats[0]),0x10);
  auVar20._0_4_ = fVar1 * auVar15._0_4_;
  auVar20._4_4_ = fVar1 * auVar15._4_4_;
  auVar20._8_4_ = fVar1 * auVar15._8_4_;
  auVar20._12_4_ = fVar1 * auVar15._12_4_;
  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar1)),ZEXT416((uint)fVar2),auVar18);
  auVar18._4_4_ = fVar2;
  auVar18._0_4_ = fVar2;
  auVar18._8_4_ = fVar2;
  auVar18._12_4_ = fVar2;
  auVar18 = vfmadd213ps_fma(auVar18,auVar19,auVar20);
  auVar21._4_4_ = fVar3;
  auVar21._0_4_ = fVar3;
  auVar21._8_4_ = fVar3;
  auVar21._12_4_ = fVar3;
  auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)fVar3),auVar17);
  fVar1 = auVar16._0_4_ + (trans->m_origin).m_floats[2];
  auVar15 = vandps_avx(auVar22,auVar15);
  auVar17._0_4_ = auVar15._0_4_ * fVar12;
  auVar17._4_4_ = auVar15._4_4_ * fVar12;
  auVar17._8_4_ = auVar15._8_4_ * fVar12;
  auVar17._12_4_ = auVar15._12_4_ * fVar12;
  auVar15 = vfmadd213ps_fma(auVar21,auVar14,auVar18);
  uVar6 = *(undefined8 *)(trans->m_origin).m_floats;
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(auVar7._0_4_ * fVar12)),ZEXT416((uint)fVar11),auVar8);
  auVar16._4_4_ = fVar11;
  auVar16._0_4_ = fVar11;
  auVar16._8_4_ = fVar11;
  auVar16._12_4_ = fVar11;
  auVar7 = vandps_avx(auVar22,auVar19);
  auVar8 = vandps_avx(auVar14,auVar22);
  auVar7 = vfmadd213ps_fma(auVar16,auVar7,auVar17);
  auVar9 = vfmadd231ss_fma(auVar18,ZEXT416((uint)fVar13),auVar9);
  auVar14._4_4_ = fVar13;
  auVar14._0_4_ = fVar13;
  auVar14._8_4_ = fVar13;
  auVar14._12_4_ = fVar13;
  auVar8 = vfmadd213ps_fma(auVar14,auVar8,auVar7);
  auVar19._0_4_ = auVar15._0_4_ + (float)uVar6;
  auVar19._4_4_ = auVar15._4_4_ + (float)((ulong)uVar6 >> 0x20);
  auVar19._8_4_ = auVar15._8_4_ + 0.0;
  auVar19._12_4_ = auVar15._12_4_ + 0.0;
  auVar7 = vsubps_avx(auVar19,auVar8);
  auVar15._0_4_ = auVar8._0_4_ + auVar19._0_4_;
  auVar15._4_4_ = auVar8._4_4_ + auVar19._4_4_;
  auVar15._8_4_ = auVar8._8_4_ + auVar19._8_4_;
  auVar15._12_4_ = auVar8._12_4_ + auVar19._12_4_;
  auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)(fVar1 - auVar9._0_4_)),0x28);
  *(undefined1 (*) [16])aabbMin->m_floats = auVar7;
  auVar7 = vinsertps_avx(auVar15,ZEXT416((uint)(auVar9._0_4_ + fVar1)),0x28);
  *(undefined1 (*) [16])aabbMax->m_floats = auVar7;
  return;
}

Assistant:

void cbtTriangleMeshShape::getAabb(const cbtTransform& trans, cbtVector3& aabbMin, cbtVector3& aabbMax) const
{
	cbtVector3 localHalfExtents = cbtScalar(0.5) * (m_localAabbMax - m_localAabbMin);
	localHalfExtents += cbtVector3(getMargin(), getMargin(), getMargin());
	cbtVector3 localCenter = cbtScalar(0.5) * (m_localAabbMax + m_localAabbMin);

	cbtMatrix3x3 abs_b = trans.getBasis().absolute();

	cbtVector3 center = trans(localCenter);

	cbtVector3 extent = localHalfExtents.dot3(abs_b[0], abs_b[1], abs_b[2]);
	aabbMin = center - extent;
	aabbMax = center + extent;
}